

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O0

void __thiscall
ft::deque<char,_ft::allocator<char>_>::deque
          (deque<char,_ft::allocator<char>_> *this,deque<char,_ft::allocator<char>_> *other)

{
  size_type n;
  const_iterator local_78;
  const_iterator local_50;
  deque<char,_ft::allocator<char>_> *local_18;
  deque<char,_ft::allocator<char>_> *other_local;
  deque<char,_ft::allocator<char>_> *this_local;
  
  local_18 = other;
  other_local = this;
  dequeIterator<char,_64UL>::dequeIterator(&this->m_start);
  dequeIterator<char,_64UL>::dequeIterator(&this->m_finish);
  this->m_map = (map_pointer)0x0;
  this->m_map_size = 0;
  this->m_chunks = 0;
  this->m_size = 0;
  get_allocator((deque<char,_ft::allocator<char>_> *)&this->field_0x70);
  n = size(local_18);
  dequeInit(this,n);
  begin(&local_50,local_18);
  end(&local_78,local_18);
  deque<char,ft::allocator<char>>::assign<ft::constDequeIterator<char,64ul>>
            ((deque<char,ft::allocator<char>> *)this,&local_50,&local_78,(type *)0x0);
  constDequeIterator<char,_64UL>::~constDequeIterator(&local_78);
  constDequeIterator<char,_64UL>::~constDequeIterator(&local_50);
  return;
}

Assistant:

deque(deque const & other):
		m_map(NULL),
		m_map_size(0),
		m_chunks(0),
		m_size(0),
		m_alloc(other.get_allocator()) {
		this->dequeInit(other.size());
		this->assign(other.begin(), other.end());
	}